

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

App * __thiscall CLI::App::excludes(App *this,App *app)

{
  OptionNotFound *pOVar1;
  pair<std::_Rb_tree_const_iterator<CLI::App_*>,_bool> pVar2;
  App *local_a0;
  _Base_ptr local_98;
  undefined1 local_90;
  _Base_ptr local_88;
  pair<std::_Rb_tree_const_iterator<CLI::App_*>,_bool> res;
  string local_70;
  undefined1 local_4d;
  allocator local_39;
  string local_38;
  App *local_18;
  App *app_local;
  App *this_local;
  
  local_18 = app;
  app_local = this;
  if (app == (App *)0x0) {
    local_4d = 1;
    pOVar1 = (OptionNotFound *)__cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_38,"nullptr passed",&local_39);
    OptionNotFound::OptionNotFound(pOVar1,&local_38);
    local_4d = 0;
    __cxa_throw(pOVar1,&OptionNotFound::typeinfo,OptionNotFound::~OptionNotFound);
  }
  if (app == this) {
    res._14_1_ = 1;
    pOVar1 = (OptionNotFound *)__cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_70,"cannot self reference in needs",(allocator *)&res.field_0xf);
    OptionNotFound::OptionNotFound(pOVar1,&local_70);
    res._14_1_ = 0;
    __cxa_throw(pOVar1,&OptionNotFound::typeinfo,OptionNotFound::~OptionNotFound);
  }
  pVar2 = std::set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>::insert
                    (&this->exclude_subcommands_,&local_18);
  local_98 = (_Base_ptr)pVar2.first._M_node;
  local_90 = pVar2.second;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_a0 = this;
    local_88 = local_98;
    res.first._M_node._0_1_ = local_90;
    std::set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>::insert
              (&local_18->exclude_subcommands_,&local_a0);
  }
  return this;
}

Assistant:

App *excludes(App *app) {
        if(app == nullptr) {
            throw OptionNotFound("nullptr passed");
        }
        if(app == this) {
            throw OptionNotFound("cannot self reference in needs");
        }
        auto res = exclude_subcommands_.insert(app);
        // subcommand exclusion should be symmetric
        if(res.second) {
            app->exclude_subcommands_.insert(this);
        }
        return this;
    }